

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void demo_textprintf(ALLEGRO_FONT *font,int x,int y,ALLEGRO_COLOR col,char *format,...)

{
  char in_AL;
  char *in_RCX;
  uint in_EDX;
  uint in_ESI;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  ALLEGRO_FONT *in_XMM0_Qa;
  int iVar2;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [512];
  undefined1 local_2f8 [32];
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 local_258;
  undefined4 local_248;
  undefined4 local_244;
  undefined1 *local_240;
  undefined1 *local_238;
  char local_228 [512];
  
  if (in_AL != '\0') {
    local_2a8 = in_XMM2_Qa;
    local_298 = in_XMM3_Qa;
    local_288 = in_XMM4_Qa;
    local_278 = in_XMM5_Qa;
    local_268 = in_XMM6_Qa;
    local_258 = in_XMM7_Qa;
  }
  local_238 = local_2f8;
  local_240 = &stack0x00000008;
  local_244 = 0x50;
  local_248 = 0x20;
  local_2d8 = in_R8;
  local_2d0 = in_R9;
  vsnprintf(local_228,0x200,in_RCX,&local_248);
  demo_textprintf_ex(in_XMM0_Qa,_iVar2,_iVar1,(ulong)in_ESI,(int)(ulong)in_EDX,(char *)0x0,"%s",
                     local_228);
  return;
}

Assistant:

void demo_textprintf(const ALLEGRO_FONT *font, int x, int y,
                     ALLEGRO_COLOR col, const char *format, ...)
{
   char buf[512];

   va_list ap;

   va_start(ap, format);
   vsnprintf(buf, sizeof(buf), format, ap);
   va_end(ap);

   demo_textprintf_ex(font, x, y, col, 0, "%s", buf);
}